

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Expression *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pDVar8;
  pointer pDVar9;
  bool bVar10;
  undefined7 uVar11;
  pointer pDVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar15 = this->len + 1;
  uVar3 = this->cap;
  if (uVar15 < uVar3 * 2) {
    uVar15 = uVar3 * 2;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    uVar15 = 0x3ffffffffffffff;
  }
  lVar16 = (long)pos - (long)this->data_;
  pDVar12 = (pointer)operator_new(uVar15 << 5);
  pEVar4 = args->value;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar6 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar12 + lVar16 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar6;
  *(undefined8 *)((long)pDVar12 + lVar16) = pEVar4;
  ((undefined8 *)((long)pDVar12 + lVar16))[1] = uVar5;
  p = this->data_;
  lVar13 = this->len * 0x20;
  lVar14 = (long)p + (lVar13 - (long)pos);
  pDVar8 = p;
  pDVar9 = pDVar12;
  if (lVar14 == 0) {
    if (this->len != 0) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->value + lVar14);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&(p->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar14 + 8);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pDVar12->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar14 + 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)&pDVar12->value + lVar14);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        lVar14 = lVar14 + 0x20;
      } while (lVar13 != lVar14);
    }
  }
  else {
    for (; pDVar8 != pos; pDVar8 = pDVar8 + 1) {
      pEVar4 = pDVar8->value;
      uVar5 = *(undefined8 *)
               &(pDVar8->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar10 = (pDVar8->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar11 = *(undefined7 *)
                &(pDVar8->weight).
                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload
                 .super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar8->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
           ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
           _M_payload._M_value.expr;
      (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar10;
      *(undefined7 *)
       &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar11;
      pDVar9->value = pEVar4;
      *(undefined8 *)
       &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar5;
      pDVar9 = pDVar9 + 1;
    }
    memcpy((void *)((long)pDVar12 + lVar16 + 0x20),pos,(lVar14 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar15;
  this->data_ = pDVar12;
  return (pointer)((long)pDVar12 + lVar16);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}